

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

int32_t anon_unknown.dwarf_fe73a::getStringArray
                  (ResourceData *pResData,ResourceArray *array,UnicodeString *dest,int32_t capacity,
                  UErrorCode *errorCode)

{
  uint uVar1;
  uint32_t res;
  ulong uVar2;
  ulong uVar3;
  ConstChar16Ptr local_50;
  uint local_48;
  int32_t sLength;
  UChar *local_40;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if (dest == (UnicodeString *)0x0) {
    if (capacity != 0) goto LAB_001aad8b;
  }
  else if (capacity < 0) {
LAB_001aad8b:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  uVar1 = array->length;
  local_48 = 0;
  if (uVar1 != 0) {
    local_48 = uVar1;
    if (capacity < (int)uVar1) {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    else {
      uVar3 = 0;
      uVar2 = 0;
      if (0 < (int)uVar1) {
        uVar2 = (ulong)uVar1;
      }
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        res = icu_63::ResourceArray::internalGetResource(array,pResData,(int32_t)uVar3);
        local_50.p_ = res_getString_63(pResData,res,&sLength);
        if (local_50.p_ == (UChar *)0x0) {
          *errorCode = U_RESOURCE_TYPE_MISMATCH;
          return 0;
        }
        icu_63::UnicodeString::setTo(dest,'\x01',&local_50,sLength);
        local_40 = local_50.p_;
        dest = dest + 1;
      }
    }
  }
  return local_48;
}

Assistant:

int32_t getStringArray(const ResourceData *pResData, const icu::ResourceArray &array,
                       icu::UnicodeString *dest, int32_t capacity,
                       UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    if(dest == NULL ? capacity != 0 : capacity < 0) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t length = array.getSize();
    if(length == 0) {
        return 0;
    }
    if(length > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return length;
    }
    for(int32_t i = 0; i < length; ++i) {
        int32_t sLength;
        const UChar *s = res_getString(pResData, array.internalGetResource(pResData, i), &sLength);
        if(s == NULL) {
            errorCode = U_RESOURCE_TYPE_MISMATCH;
            return 0;
        }
        dest[i].setTo(TRUE, s, sLength);
    }
    return length;
}